

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void QuestUnserialize(string *serialized,Character *character)

{
  undefined2 uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  char cVar9;
  bool bVar10;
  pointer pbVar11;
  pair<std::_Rb_tree_iterator<Character_QuestState>,_bool> pVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>,_bool>
  pVar13;
  shared_ptr<Quest_Context> quest_context;
  Character_QuestState state;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> part;
  Quest *quest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Character *local_100;
  string local_f8;
  Quest_Context *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  undefined1 local_c0 [8];
  string local_b8;
  const_iterator local_98;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78 [2];
  long local_68 [2];
  pointer local_58;
  _Base_ptr local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_100 = character;
  util::explode(&local_48,';',serialized);
  local_58 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar10 = false;
    pbVar11 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_78[0] = local_68;
      pcVar2 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar2,pcVar2 + pbVar11->_M_string_length);
      cVar9 = (char)(string *)local_78;
      lVar5 = std::__cxx11::string::find(cVar9,0x2c);
      if (lVar5 != -1) {
        lVar5 = std::__cxx11::string::find(cVar9,0x2c);
        local_b8._M_dataplus._M_p = local_c0 + 0x18;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_98._M_current = (char *)&local_88;
        local_90 = (char *)0x0;
        local_88._M_local_buf[0] = '\0';
        std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_78);
        iVar4 = util::to_int(&local_f8);
        local_c0._0_2_ = (undefined2)iVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_f8._M_dataplus._M_p._2_6_,(short)local_f8._M_dataplus._M_p) !=
            &local_f8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(local_f8._M_dataplus._M_p._2_6_,(short)local_f8._M_dataplus._M_p)
                          ,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        if (lVar5 == -1) {
          std::__cxx11::string::find((char)local_78,0x3b);
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_78);
          std::__cxx11::string::operator=((string *)(local_c0 + 8),(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_f8._M_dataplus._M_p._2_6_,(short)local_f8._M_dataplus._M_p) !=
              &local_f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_f8._M_dataplus._M_p._2_6_,
                                     (short)local_f8._M_dataplus._M_p),
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
LAB_00112f9e:
          std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,0x1a216e);
LAB_00112fbc:
          bVar3 = !bVar10;
          bVar10 = true;
          if (bVar3) {
            Console::Wrn("Converting quests from old format...");
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_78);
          std::__cxx11::string::operator=((string *)(local_c0 + 8),(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_f8._M_dataplus._M_p._2_6_,(short)local_f8._M_dataplus._M_p) !=
              &local_f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_f8._M_dataplus._M_p._2_6_,
                                     (short)local_f8._M_dataplus._M_p),
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_78);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT62(local_f8._M_dataplus._M_p._2_6_,(short)local_f8._M_dataplus._M_p) !=
              &local_f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT62(local_f8._M_dataplus._M_p._2_6_,
                                     (short)local_f8._M_dataplus._M_p),
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
          if (local_90 == (char *)0x0) goto LAB_00112fbc;
          if (*local_98._M_current != '{') {
            Console::Wrn("State progress counter reset for quest: %i");
            goto LAB_00112f9e;
          }
        }
        p_Var8 = (local_100->world->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_0011301c:
          Console::Wrn("Quest not found: %i. Marking as inactive.");
          pVar12 = std::
                   _Rb_tree<Character_QuestState,_Character_QuestState,_std::_Identity<Character_QuestState>,_std::less<Character_QuestState>,_std::allocator<Character_QuestState>_>
                   ::_M_insert_unique<Character_QuestState>
                             (&(local_100->quests_inactive)._M_t,(Character_QuestState *)local_c0);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            Console::Wrn("Duplicate inactive quest record dropped for quest: %i",
                         (ulong)(uint)(int)(short)local_c0._0_2_);
          }
        }
        else {
          p_Var6 = &(local_100->world->quests)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = &p_Var6->_M_header;
          do {
            uVar1 = (undefined2)p_Var8[1]._M_color;
            if ((short)local_c0._0_2_ <= (short)uVar1) {
              p_Var7 = p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[(short)uVar1 < (short)local_c0._0_2_];
          } while (p_Var8 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 == p_Var6) ||
             ((short)local_c0._0_2_ < (short)p_Var7[1]._M_color)) goto LAB_0011301c;
          local_50 = p_Var7[1]._M_parent;
          local_d8 = (Quest_Context *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Quest_Context,std::allocator<Quest_Context>,Character*&,Quest*&>
                    (a_Stack_d0,&local_d8,(allocator<Quest_Context> *)&local_f8,&local_100,
                     (Quest **)&local_50);
          EOPlus::Context::SetState(&local_d8->super_Context,(string *)(local_c0 + 8),false);
          Quest_Context::UnserializeProgress
                    (local_d8,local_98,(const_iterator)(local_90 + local_98._M_current));
          local_f8._M_dataplus._M_p._0_2_ = local_c0._0_2_;
          local_f8._M_string_length = (size_type)local_d8;
          local_f8.field_2._M_allocated_capacity = (size_type)a_Stack_d0[0]._M_pi;
          local_d8 = (Quest_Context *)0x0;
          a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pVar13 = std::
                   _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                   ::_M_emplace_unique<std::pair<short,std::shared_ptr<Quest_Context>>>
                             ((_Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest_Context>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest_Context>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest_Context>>>>
                               *)&local_100->quests,
                              (pair<short,_std::shared_ptr<Quest_Context>_> *)&local_f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.field_2._M_allocated_capacity
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_f8.field_2._M_allocated_capacity);
          }
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            Console::Wrn("Duplicate quest record dropped for quest: %i",
                         (ulong)(uint)(int)(short)local_c0._0_2_);
          }
          if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_current != &local_88) {
          operator_delete(local_98._M_current,
                          CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) +
                          1);
        }
        if (local_b8._M_dataplus._M_p != local_c0 + 0x18) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void QuestUnserialize(std::string serialized, Character* character)
{
	bool conversion_warned = false;

	std::vector<std::string> parts = util::explode(';', serialized);

	UTIL_FOREACH(parts, part)
	{
		std::size_t pp1 = part.find_first_of(',');

		if (pp1 == std::string::npos)
			continue;

		std::size_t pp2 = part.find_first_of(',', pp1 + 1);

		Character_QuestState state;
		state.quest_id = util::to_int(part.substr(0, pp1));

		bool conversion_needed = false;

		if (pp2 != std::string::npos)
		{
			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = part.substr(pp2 + 1);

			if (!state.quest_progress.empty() && state.quest_progress[0] != '{')
			{
				conversion_needed = true;

				// We could peek at the quest state for a possible matching rule here,
				// but it would greatly complicate the unserialization code.
				Console::Wrn("State progress counter reset for quest: %i", state.quest_id);
				state.quest_progress = "{}";
			}
			else if (state.quest_progress.empty())
			{
				conversion_needed = true;
			}
		}
		else
		{
			pp2 = part.find_first_of(';', pp1 + 1);

			if (pp2 == std::string::npos)
				pp2 = part.length() + 1;

			state.quest_state = part.substr(pp1 + 1, pp2 - pp1 - 1);
			state.quest_progress = "{}";

			conversion_needed = true;
		}

		if (conversion_needed)
		{
			if (!conversion_warned)
			{
				Console::Wrn("Converting quests from old format...");
				conversion_warned = true;
			}

			// Vodka leaves the quest state set to the end of the quest, which
			// means everyone will get stuck in an unfinished state
		}

		auto quest_it = character->world->quests.find(state.quest_id);

		if (quest_it == character->world->quests.end())
		{
			Console::Wrn("Quest not found: %i. Marking as inactive.", state.quest_id);

			// Store it in a non-activate state so we don't have to delete the data
			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest* quest = quest_it->second.get();
		auto quest_context(std::make_shared<Quest_Context>(character, quest));

		try
		{
			quest_context->SetState(state.quest_state, false);
			quest_context->UnserializeProgress(UTIL_CRANGE(state.quest_progress));
		}
		catch (EOPlus::Runtime_Error& ex)
		{
			Console::Wrn(ex.what());
			Console::Wrn("Could not resume quest: %i. Marking as inactive.", state.quest_id);

			if (!character->quests_inactive.insert(std::move(state)).second)
				Console::Wrn("Duplicate inactive quest record dropped for quest: %i", state.quest_id);

			continue;
		}

		auto result = character->quests.insert(std::make_pair(state.quest_id, std::move(quest_context)));

		if (!result.second)
		{
			Console::Wrn("Duplicate quest record dropped for quest: %i", state.quest_id);
			continue;
		}
	}
}